

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_genprime.c
# Opt level: O0

int main(int argc,char **argv)

{
  int *Q_00;
  char *__s;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t len;
  FILE *__stream;
  bool bVar4;
  char *q;
  char *p;
  int i;
  int nbits;
  FILE *fout;
  char *pers;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi G;
  int exit_code;
  int ret;
  char **argv_local;
  int argc_local;
  
  G.p._0_4_ = 1;
  p._4_4_ = 0x800;
  mbedtls_mpi_init((mbedtls_mpi *)&P.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_init((mbedtls_mpi *)&entropy.source[0x13].strong);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&pers);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  if (argc == 0) {
LAB_0010334a:
    printf(
          "\n usage: dh_genprime param=<>...\n\n acceprable parameters:\n    bits=%%d           default: 2048\n"
          );
    return 1;
  }
  for (p._0_4_ = 1; (int)p < argc; p._0_4_ = (int)p + 1) {
    __s = argv[(int)p];
    pcVar3 = strchr(__s,0x3d);
    if (pcVar3 == (char *)0x0) goto LAB_0010334a;
    *pcVar3 = '\0';
    iVar1 = strcmp(__s,"bits");
    if (((iVar1 != 0) || (p._4_4_ = atoi(pcVar3 + 1), p._4_4_ < 0)) || (0x2000 < p._4_4_))
    goto LAB_0010334a;
  }
  uVar2 = mbedtls_mpi_read_string((mbedtls_mpi *)&P.p,10,"4");
  if (uVar2 == 0) {
    printf("  ! Generating large primes may take minutes!\n");
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    len = strlen("dh_genprime");
    uVar2 = mbedtls_ctr_drbg_seed
                      ((mbedtls_ctr_drbg_context *)&pers,mbedtls_entropy_func,&ctr_drbg.p_entropy,
                       (uchar *)"dh_genprime",len);
    if (uVar2 == 0) {
      printf(" ok\n  . Generating the modulus, please wait...");
      fflush(_stdout);
      uVar2 = mbedtls_mpi_gen_prime
                        ((mbedtls_mpi *)&Q.p,(long)p._4_4_,1,mbedtls_ctr_drbg_random,&pers);
      if (uVar2 == 0) {
        printf(" ok\n  . Verifying that Q = (P-1)/2 is prime...");
        fflush(_stdout);
        uVar2 = mbedtls_mpi_sub_int((mbedtls_mpi *)&entropy.source[0x13].strong,(mbedtls_mpi *)&Q.p,
                                    1);
        if (uVar2 == 0) {
          Q_00 = &entropy.source[0x13].strong;
          uVar2 = mbedtls_mpi_div_int((mbedtls_mpi *)Q_00,(mbedtls_mpi *)0x0,(mbedtls_mpi *)Q_00,2);
          if (uVar2 == 0) {
            uVar2 = mbedtls_mpi_is_prime_ext
                              ((mbedtls_mpi *)&entropy.source[0x13].strong,0x32,
                               mbedtls_ctr_drbg_random,&pers);
            if (uVar2 == 0) {
              printf(" ok\n  . Exporting the value in dh_prime.txt...");
              fflush(_stdout);
              __stream = fopen("dh_prime.txt","wb+");
              if (__stream == (FILE *)0x0) {
                printf(" failed\n  ! Could not create dh_prime.txt\n\n");
              }
              else {
                iVar1 = mbedtls_mpi_write_file("P = ",(mbedtls_mpi *)&Q.p,0x10,(FILE *)__stream);
                bVar4 = iVar1 != 0;
                if (!bVar4) {
                  iVar1 = mbedtls_mpi_write_file("G = ",(mbedtls_mpi *)&P.p,0x10,(FILE *)__stream);
                  bVar4 = iVar1 != 0;
                  if (!bVar4) {
                    printf(" ok\n\n");
                    fclose(__stream);
                    G.p._0_4_ = 0;
                    goto LAB_001036f1;
                  }
                }
                printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)bVar4);
                fclose(__stream);
              }
            }
            else {
              printf(" failed\n  ! mbedtls_mpi_is_prime returned %d\n\n",(ulong)uVar2);
            }
          }
          else {
            printf(" failed\n  ! mbedtls_mpi_div_int returned %d\n\n",(ulong)uVar2);
          }
        }
        else {
          printf(" failed\n  ! mbedtls_mpi_sub_int returned %d\n\n",(ulong)uVar2);
        }
      }
      else {
        printf(" failed\n  ! mbedtls_mpi_gen_prime returned %d\n\n",(ulong)uVar2);
      }
    }
    else {
      printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)uVar2);
    }
  }
  else {
    printf(" failed\n  ! mbedtls_mpi_read_string returned %d\n",(ulong)uVar2);
  }
LAB_001036f1:
  mbedtls_mpi_free((mbedtls_mpi *)&P.p);
  mbedtls_mpi_free((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_free((mbedtls_mpi *)&entropy.source[0x13].strong);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&pers);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return (int)G.p;
}

Assistant:

int main( int argc, char **argv )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_mpi G, P, Q;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    const char *pers = "dh_genprime";
    FILE *fout;
    int nbits = DFL_BITS;
    int i;
    char *p, *q;

    mbedtls_mpi_init( &G ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_entropy_init( &entropy );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        return( exit_code );
    }

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "bits" ) == 0 )
        {
            nbits = atoi( q );
            if( nbits < 0 || nbits > MBEDTLS_MPI_MAX_BITS )
                goto usage;
        }
        else
            goto usage;
    }

    if( ( ret = mbedtls_mpi_read_string( &G, 10, GENERATOR ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_string returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( "  ! Generating large primes may take minutes!\n" );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating the modulus, please wait..." );
    fflush( stdout );

    /*
     * This can take a long time...
     */
    if( ( ret = mbedtls_mpi_gen_prime( &P, nbits, 1,
                               mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_gen_prime returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Verifying that Q = (P-1)/2 is prime..." );
    fflush( stdout );

    if( ( ret = mbedtls_mpi_sub_int( &Q, &P, 1 ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_sub_int returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_div_int( &Q, NULL, &Q, 2 ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_div_int returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_is_prime_ext( &Q, 50, mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_is_prime returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the value in dh_prime.txt..." );
    fflush( stdout );

    if( ( fout = fopen( "dh_prime.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! Could not create dh_prime.txt\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "P = ", &P, 16, fout ) != 0 ) ||
        ( ret = mbedtls_mpi_write_file( "G = ", &G, 16, fout ) != 0 ) )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        fclose( fout );
        goto exit;
    }

    mbedtls_printf( " ok\n\n" );
    fclose( fout );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    mbedtls_mpi_free( &G ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}